

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::SPxFastRT<double>::maxShortLeave
          (SPxFastRT<double> *this,double *sel,int leave,double maxabs)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SPxSolverBase<double> *pSVar4;
  UpdateVector<double> *pUVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  peVar3 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->super_SPxRatioTester<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar9 = -(ulong)(dVar1 == 1.0);
  dVar1 = (double)(~uVar9 & (ulong)(dVar1 * 1e-05) | uVar9 & 0x3ee4f8b588e368f1);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pSVar4 = (this->super_SPxRatioTester<double>).thesolver;
  pUVar5 = pSVar4->theFvec;
  lVar7 = (long)leave;
  dVar2 = (pUVar5->thedelta).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar7];
  *sel = dVar2;
  lVar8 = 0x670;
  if ((dVar1 * maxabs < dVar2) || (lVar8 = 0x688, dVar2 < dVar1 * -maxabs)) {
    *sel = (*(double *)
             (*(long *)((long)&(pSVar4->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                               super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                               _vptr_ClassArray + lVar8) + lVar7 * 8) -
           (pUVar5->super_VectorBase<double>).val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar7]) / dVar2;
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool SPxFastRT<R>::maxShortLeave(R& sel, int leave, R maxabs)
{
   assert(leave >= 0);
   assert(maxabs >= 0);

   R shortval = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_SHORTVAL);

   sel = this->thesolver->fVec().delta()[leave];

   if(sel > maxabs * shortval)
   {
      sel = (this->thesolver->ubBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   if(sel < -maxabs * shortval)
   {
      sel = (this->thesolver->lbBound()[leave] - this->thesolver->fVec()[leave]) / sel;
      return true;
   }

   return false;
}